

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

_Bool bitset_contains_all(bitset_t *b1,bitset_t *b2)

{
  ulong *puVar1;
  ulong *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_t k;
  ulong uVar6;
  ulong uVar7;
  _Bool _Var8;
  
  uVar6 = b1->arraysize;
  uVar4 = b2->arraysize;
  uVar5 = uVar4;
  if (uVar6 < uVar4) {
    uVar5 = uVar6;
  }
  uVar7 = 0;
  while (uVar5 != uVar7) {
    puVar1 = b1->array + uVar7;
    puVar2 = b2->array + uVar7;
    uVar7 = uVar7 + 1;
    if ((*puVar2 & ~*puVar1) != 0) {
      return false;
    }
  }
  _Var8 = true;
  if (uVar6 < uVar4) {
    do {
      _Var8 = uVar4 <= uVar6;
      if (_Var8) {
        return _Var8;
      }
      puVar3 = b2->array + uVar6;
      uVar6 = uVar6 + 1;
    } while (*puVar3 == 0);
  }
  return _Var8;
}

Assistant:

bool bitset_contains_all(const bitset_t * CBITSET_RESTRICT b1, const bitset_t * CBITSET_RESTRICT b2) {
  size_t min_size = b1->arraysize;
  if(b1->arraysize > b2->arraysize) {
    min_size = b2->arraysize;
  }
  for(size_t k = 0; k < min_size; k++) {
    if((b1->array[k] & b2->array[k]) != b2->array[k]) {
      return false;
    }
  }
  if(b2->arraysize > b1->arraysize) {
    /* Need to check if b2 has any bits set beyond b1's array */
    return !any_bits_set(b2, b1->arraysize);
  }
  return true;
}